

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O0

void multi_kv_custom_cmp_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  fdb_custom_cmp_variable functions_1 [1];
  char *kvs_names_1 [1];
  fdb_custom_cmp_variable functions [1];
  char *kvs_names [1];
  fdb_status s;
  fdb_iterator *it;
  fdb_doc *doc;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *kv2;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char valuestr [14];
  char keystr [8];
  char valueBuf [256];
  char keyBuf [256];
  char value [256];
  char key [256];
  int r;
  int i;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffff808;
  fdb_file_handle *fhandle;
  ulong uVar4;
  fdb_iterator *iterator;
  fdb_iterator *in_stack_fffffffffffff810;
  fdb_iterator *in_stack_fffffffffffff818;
  fdb_iterator *in_stack_fffffffffffff820;
  fdb_iterator *in_stack_fffffffffffff828;
  fdb_iterator *in_stack_fffffffffffff840;
  fdb_doc **in_stack_fffffffffffff880;
  fdb_iterator *in_stack_fffffffffffff888;
  undefined1 local_6e0 [24];
  void **local_6c8;
  undefined1 local_6c0 [112];
  fdb_kvs_config *in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  fdb_kvs_handle **in_stack_fffffffffffff9c0;
  fdb_file_handle *in_stack_fffffffffffff9c8;
  fdb_custom_cmp_variable *in_stack_fffffffffffffa20;
  fdb_config *in_stack_fffffffffffffa28;
  char *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  fdb_iterator *in_stack_fffffffffffffa40;
  fdb_doc *in_stack_fffffffffffffa48;
  void **user_params;
  undefined1 local_598 [8];
  undefined8 local_590;
  undefined8 local_588;
  undefined1 local_580;
  undefined1 local_578;
  undefined1 local_558;
  fdb_kvs_handle *local_4a0;
  fdb_kvs_handle *local_498;
  fdb_kvs_handle *local_490;
  char local_47e [14];
  char local_470 [8];
  undefined1 local_468 [256];
  undefined1 local_368 [256];
  fdb_doc *local_268 [32];
  fdb_iterator local_168;
  int local_5c;
  uint local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_54 = 1000;
  builtin_strncpy(local_470,"key%06d",8);
  builtin_strncpy(local_47e,"value%08d(%s)",0xe);
  sprintf((char *)local_268,"rm -rf  multi_kv_test*");
  local_5c = system((char *)local_268);
  memleak_start();
  fdb_get_default_config();
  memcpy(local_598,local_6c0,0xf8);
  fdb_get_default_kvs_config();
  local_578 = 1;
  local_558 = 1;
  local_588 = 0x100;
  local_580 = 0;
  local_590 = 0;
  fVar1 = fdb_open((fdb_file_handle **)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38)
                   ,in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  user_params = local_6c8;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x724);
    multi_kv_custom_cmp_test::__test_pass = 0;
    user_params = local_6c8;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x724,"void multi_kv_custom_cmp_test()");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8
                       ,in_stack_fffffffffffff9b0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x726);
    multi_kv_custom_cmp_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x726,"void multi_kv_custom_cmp_test()");
    }
  }
  for (local_58 = 0; (int)local_58 < (int)local_54; local_58 = local_58 + 1) {
    sprintf((char *)&local_168,local_470,(ulong)local_58);
    sprintf((char *)local_268,local_47e,(ulong)local_58,"default");
    strlen((char *)&local_168);
    sVar3 = strlen((char *)local_268);
    in_stack_fffffffffffff808 = (fdb_file_handle *)(sVar3 + 1);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                   (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                   (size_t)in_stack_fffffffffffff808,(void *)0x118202,
                   (size_t)in_stack_fffffffffffff840);
    fVar1 = fdb_set(local_490,in_stack_fffffffffffffa48);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x72e);
      multi_kv_custom_cmp_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x72e,"void multi_kv_custom_cmp_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x118290);
  }
  fVar1 = fdb_commit(in_stack_fffffffffffff808,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x732);
    multi_kv_custom_cmp_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x732,"void multi_kv_custom_cmp_test()");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8
                       ,in_stack_fffffffffffff9b0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x737);
    multi_kv_custom_cmp_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x737,"void multi_kv_custom_cmp_test()");
    }
  }
  for (local_58 = 0; (int)local_58 < (int)local_54; local_58 = local_58 + 1) {
    sprintf((char *)&local_168,local_470,(ulong)local_58);
    sprintf((char *)local_268,local_47e,(ulong)local_58,"kv1_custom_cmp");
    strlen((char *)&local_168);
    sVar3 = strlen((char *)local_268);
    in_stack_fffffffffffff808 = (fdb_file_handle *)(sVar3 + 1);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                   (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                   (size_t)in_stack_fffffffffffff808,(void *)0x11849d,
                   (size_t)in_stack_fffffffffffff840);
    fVar1 = fdb_set(local_498,in_stack_fffffffffffffa48);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x73f);
      multi_kv_custom_cmp_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x73f,"void multi_kv_custom_cmp_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x11852b);
  }
  fVar1 = fdb_commit(in_stack_fffffffffffff808,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x743);
    multi_kv_custom_cmp_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x743,"void multi_kv_custom_cmp_test()");
    }
  }
  local_58 = 0;
  while( true ) {
    if ((int)local_54 <= (int)local_58) {
      fVar1 = fdb_close(in_stack_fffffffffffff808);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x759);
        multi_kv_custom_cmp_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x759,"void multi_kv_custom_cmp_test()");
        }
        fVar1 = FDB_RESULT_SUCCESS;
      }
      fVar1 = fdb_open((fdb_file_handle **)CONCAT44(fVar1,in_stack_fffffffffffffa38),
                       in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x75c);
        multi_kv_custom_cmp_test::__test_pass = 0;
        if (fVar1 == FDB_RESULT_SUCCESS) {
          __assert_fail("s != FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x75c,"void multi_kv_custom_cmp_test()");
        }
      }
      memset(local_6e0,0,8);
      fVar1 = fdb_open_custom_cmp((fdb_file_handle **)in_stack_fffffffffffffa48,
                                  (char *)in_stack_fffffffffffffa40,
                                  (fdb_config *)CONCAT44(fVar1,in_stack_fffffffffffffa38),
                                  (size_t)in_stack_fffffffffffffa30,
                                  (char **)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                                  user_params);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x763);
        multi_kv_custom_cmp_test::__test_pass = 0;
        if (fVar1 == FDB_RESULT_SUCCESS) {
          __assert_fail("s != FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x763,"void multi_kv_custom_cmp_test()");
        }
      }
      fhandle = (fdb_file_handle *)0x0;
      fVar1 = fdb_open_custom_cmp((fdb_file_handle **)in_stack_fffffffffffffa48,
                                  (char *)in_stack_fffffffffffffa40,
                                  (fdb_config *)CONCAT44(fVar1,in_stack_fffffffffffffa38),
                                  (size_t)in_stack_fffffffffffffa30,
                                  (char **)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                                  user_params);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x76b);
        multi_kv_custom_cmp_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x76b,"void multi_kv_custom_cmp_test()");
        }
      }
      fVar1 = fdb_kvs_open(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                           in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x76f);
        multi_kv_custom_cmp_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x76f,"void multi_kv_custom_cmp_test()");
        }
      }
      fVar1 = fdb_kvs_open(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                           in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x771);
        multi_kv_custom_cmp_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x771,"void multi_kv_custom_cmp_test()");
        }
      }
      local_58 = 0;
      while( true ) {
        if ((int)local_54 <= (int)local_58) {
          fVar1 = fdb_kvs_open(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                               in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x788);
            multi_kv_custom_cmp_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x788,"void multi_kv_custom_cmp_test()");
            }
          }
          for (local_58 = 0; (int)local_58 < (int)local_54; local_58 = local_58 + 1) {
            sprintf((char *)&local_168,local_470,(ulong)local_58);
            sprintf((char *)local_268,local_47e,(ulong)local_58,"kv2");
            strlen((char *)&local_168);
            sVar3 = strlen((char *)local_268);
            fhandle = (fdb_file_handle *)(sVar3 + 1);
            fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                           (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                           (size_t)fhandle,(void *)0x1191c0,(size_t)in_stack_fffffffffffff840);
            fVar1 = fdb_set(local_4a0,in_stack_fffffffffffffa48);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x790);
              multi_kv_custom_cmp_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x790,"void multi_kv_custom_cmp_test()");
              }
            }
            fdb_doc_free((fdb_doc *)0x11924e);
          }
          fVar1 = fdb_commit(fhandle,'\0');
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x794);
            multi_kv_custom_cmp_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x794,"void multi_kv_custom_cmp_test()");
            }
          }
          local_58 = 0;
          while( true ) {
            if ((int)local_54 <= (int)local_58) {
              for (local_58 = 0; (int)local_58 < (int)local_54; local_58 = local_58 + 1) {
                sprintf((char *)&local_168,local_470,(ulong)local_58);
                sprintf((char *)local_268,local_47e,(ulong)local_58,"default(updated)");
                strlen((char *)&local_168);
                in_stack_fffffffffffff880 = local_268;
                sVar3 = strlen((char *)local_268);
                fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                               (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,sVar3 + 1
                               ,(void *)0x11989e,(size_t)in_stack_fffffffffffff840);
                fVar1 = fdb_set(local_490,in_stack_fffffffffffffa48);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7b5);
                  multi_kv_custom_cmp_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x7b5,"void multi_kv_custom_cmp_test()");
                  }
                }
                fdb_doc_free((fdb_doc *)0x11992c);
                sprintf((char *)&local_168,local_470,(ulong)local_58);
                sprintf((char *)local_268,local_47e,(ulong)local_58,"kv1_custom_cmp(updated)");
                strlen((char *)&local_168);
                sVar3 = strlen((char *)local_268);
                fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                               (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,sVar3 + 1
                               ,(void *)0x1199d8,(size_t)in_stack_fffffffffffff840);
                fVar1 = fdb_set(local_498,in_stack_fffffffffffffa48);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7bc);
                  multi_kv_custom_cmp_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x7bc,"void multi_kv_custom_cmp_test()");
                  }
                }
                fdb_doc_free((fdb_doc *)0x119a66);
                sprintf((char *)&local_168,local_470,(ulong)local_58);
                sprintf((char *)local_268,local_47e,(ulong)local_58,"kv2(updated)");
                in_stack_fffffffffffff840 = &local_168;
                strlen((char *)&local_168);
                sVar3 = strlen((char *)local_268);
                fhandle = (fdb_file_handle *)(sVar3 + 1);
                fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                               (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                               (size_t)fhandle,(void *)0x119b12,(size_t)in_stack_fffffffffffff840);
                fVar1 = fdb_set(local_4a0,in_stack_fffffffffffffa48);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7c3);
                  multi_kv_custom_cmp_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x7c3,"void multi_kv_custom_cmp_test()");
                  }
                }
                fdb_doc_free((fdb_doc *)0x119ba0);
              }
              fVar1 = fdb_commit(fhandle,'\0');
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x7c8);
                multi_kv_custom_cmp_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7c8,"void multi_kv_custom_cmp_test()");
                }
              }
              local_58 = 0;
              while( true ) {
                if ((int)local_54 <= (int)local_58) {
                  fVar1 = fdb_compact((fdb_file_handle *)in_stack_fffffffffffff810,(char *)fhandle);
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x7e5);
                    multi_kv_custom_cmp_test::__test_pass = 0;
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      __assert_fail("s == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x7e5,"void multi_kv_custom_cmp_test()");
                    }
                  }
                  local_58 = 0;
                  while( true ) {
                    if ((int)local_54 <= (int)local_58) {
                      uVar4 = 0;
                      fVar1 = fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,
                                             in_stack_fffffffffffff820,
                                             (size_t)in_stack_fffffffffffff818,
                                             in_stack_fffffffffffff810,0,(void *)0x11a69b,
                                             (size_t)in_stack_fffffffffffff840);
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x802);
                        multi_kv_custom_cmp_test::__test_pass = 0;
                        if (fVar1 != FDB_RESULT_SUCCESS) {
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x802,"void multi_kv_custom_cmp_test()");
                        }
                      }
                      in_stack_fffffffffffffa48->key = local_368;
                      in_stack_fffffffffffffa48->body = local_468;
                      local_58 = 0;
                      iterator = (fdb_iterator *)(uVar4 & 0xffffffff00000000);
                      fVar1 = fdb_iterator_init(local_498,(fdb_iterator **)&stack0xfffffffffffffa40,
                                                (void *)0x0,0,(void *)0x0,0,0);
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x809);
                        multi_kv_custom_cmp_test::__test_pass = 0;
                        if (fVar1 != FDB_RESULT_SUCCESS) {
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x809,"void multi_kv_custom_cmp_test()");
                        }
                      }
                      do {
                        fVar1 = fdb_iterator_get(in_stack_fffffffffffff888,in_stack_fffffffffffff880
                                                );
                        if (fVar1 != FDB_RESULT_SUCCESS) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x80c);
                          multi_kv_custom_cmp_test::__test_pass = 0;
                          if (fVar1 != FDB_RESULT_SUCCESS) {
                            __assert_fail("s == FDB_RESULT_SUCCESS",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                          ,0x80c,"void multi_kv_custom_cmp_test()");
                          }
                        }
                        sprintf((char *)&local_168,local_470,(ulong)local_58);
                        sprintf((char *)local_268,local_47e,(ulong)local_58,
                                "kv1_custom_cmp(updated)");
                        iVar2 = memcmp(in_stack_fffffffffffffa48->key,&local_168,
                                       in_stack_fffffffffffffa48->keylen);
                        if (iVar2 != 0) {
                          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&local_168,
                                  in_stack_fffffffffffffa48->key,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x80f);
                          multi_kv_custom_cmp_test::__test_pass = 0;
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x80f,"void multi_kv_custom_cmp_test()");
                        }
                        iVar2 = memcmp(in_stack_fffffffffffffa48->body,local_268,
                                       in_stack_fffffffffffffa48->bodylen);
                        if (iVar2 != 0) {
                          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_268,
                                  in_stack_fffffffffffffa48->body,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x810);
                          multi_kv_custom_cmp_test::__test_pass = 0;
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x810,"void multi_kv_custom_cmp_test()");
                        }
                        local_58 = local_58 + 1;
                        fVar1 = fdb_iterator_next(iterator);
                      } while (fVar1 == FDB_RESULT_SUCCESS);
                      if (local_58 != local_54) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x813);
                        multi_kv_custom_cmp_test::__test_pass = 0;
                        if (local_58 != local_54) {
                          __assert_fail("i == n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x813,"void multi_kv_custom_cmp_test()");
                        }
                      }
                      fVar1 = fdb_iterator_close(in_stack_fffffffffffff818);
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x815);
                        multi_kv_custom_cmp_test::__test_pass = 0;
                        if (fVar1 != FDB_RESULT_SUCCESS) {
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x815,"void multi_kv_custom_cmp_test()");
                        }
                      }
                      fVar1 = fdb_close((fdb_file_handle *)iterator);
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x818);
                        multi_kv_custom_cmp_test::__test_pass = 0;
                        if (fVar1 != FDB_RESULT_SUCCESS) {
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x818,"void multi_kv_custom_cmp_test()");
                        }
                      }
                      fVar1 = fdb_shutdown();
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x81a);
                        multi_kv_custom_cmp_test::__test_pass = 0;
                        if (fVar1 != FDB_RESULT_SUCCESS) {
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x81a,"void multi_kv_custom_cmp_test()");
                        }
                      }
                      in_stack_fffffffffffffa48->key = (void *)0x0;
                      in_stack_fffffffffffffa48->body = (void *)0x0;
                      fVar1 = fdb_doc_free((fdb_doc *)0x11abd7);
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x81f);
                        multi_kv_custom_cmp_test::__test_pass = 0;
                        if (fVar1 != FDB_RESULT_SUCCESS) {
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x81f,"void multi_kv_custom_cmp_test()");
                        }
                      }
                      memleak_end();
                      if (multi_kv_custom_cmp_test::__test_pass == 0) {
                        fprintf(_stderr,"%s FAILED\n",
                                "multiple KV instances custom comparison function test");
                      }
                      else {
                        fprintf(_stderr,"%s PASSED\n",
                                "multiple KV instances custom comparison function test");
                      }
                      return;
                    }
                    sprintf((char *)&local_168,local_470,(ulong)local_58);
                    sprintf((char *)local_268,local_47e,(ulong)local_58,"default(updated)");
                    in_stack_fffffffffffff820 = &local_168;
                    strlen((char *)&local_168);
                    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                                   (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                                   (void *)0x11a23b,(size_t)in_stack_fffffffffffff840);
                    fVar1 = fdb_get(local_490,in_stack_fffffffffffffa48);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7ed);
                      multi_kv_custom_cmp_test::__test_pass = 0;
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        __assert_fail("s == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x7ed,"void multi_kv_custom_cmp_test()");
                      }
                    }
                    iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,
                                   in_stack_fffffffffffffa48->bodylen);
                    if (iVar2 != 0) {
                      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                              in_stack_fffffffffffffa48->body,local_268,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7ee);
                      multi_kv_custom_cmp_test::__test_pass = 0;
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x7ee,"void multi_kv_custom_cmp_test()");
                    }
                    fdb_doc_free((fdb_doc *)0x11a355);
                    sprintf((char *)local_268,local_47e,(ulong)local_58,"kv1_custom_cmp(updated)");
                    in_stack_fffffffffffff818 = &local_168;
                    strlen((char *)&local_168);
                    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                                   (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                                   (void *)0x11a3c0,(size_t)in_stack_fffffffffffff840);
                    fVar1 = fdb_get(local_498,in_stack_fffffffffffffa48);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7f4);
                      multi_kv_custom_cmp_test::__test_pass = 0;
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        __assert_fail("s == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x7f4,"void multi_kv_custom_cmp_test()");
                      }
                    }
                    iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,
                                   in_stack_fffffffffffffa48->bodylen);
                    if (iVar2 != 0) {
                      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                              in_stack_fffffffffffffa48->body,local_268,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7f5);
                      multi_kv_custom_cmp_test::__test_pass = 0;
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x7f5,"void multi_kv_custom_cmp_test()");
                    }
                    fdb_doc_free((fdb_doc *)0x11a4da);
                    sprintf((char *)local_268,local_47e,(ulong)local_58,"kv2(updated)");
                    in_stack_fffffffffffff810 = &local_168;
                    strlen((char *)&local_168);
                    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                                   (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                                   (void *)0x11a545,(size_t)in_stack_fffffffffffff840);
                    fVar1 = fdb_get(local_4a0,in_stack_fffffffffffffa48);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7fb);
                      multi_kv_custom_cmp_test::__test_pass = 0;
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        __assert_fail("s == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x7fb,"void multi_kv_custom_cmp_test()");
                      }
                    }
                    iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,
                                   in_stack_fffffffffffffa48->bodylen);
                    if (iVar2 != 0) break;
                    fdb_doc_free((fdb_doc *)0x11a65f);
                    local_58 = local_58 + 1;
                  }
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                          in_stack_fffffffffffffa48->body,local_268,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7fc);
                  multi_kv_custom_cmp_test::__test_pass = 0;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7fc,"void multi_kv_custom_cmp_test()");
                }
                sprintf((char *)&local_168,local_470,(ulong)local_58);
                sprintf((char *)local_268,local_47e,(ulong)local_58,"default(updated)");
                strlen((char *)&local_168);
                fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                               (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                               (void *)0x119cd9,(size_t)in_stack_fffffffffffff840);
                fVar1 = fdb_get(local_490,in_stack_fffffffffffffa48);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,2000);
                  multi_kv_custom_cmp_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,2000,"void multi_kv_custom_cmp_test()");
                  }
                }
                iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,
                               in_stack_fffffffffffffa48->bodylen);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                          in_stack_fffffffffffffa48->body,local_268,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7d1);
                  multi_kv_custom_cmp_test::__test_pass = 0;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7d1,"void multi_kv_custom_cmp_test()");
                }
                fdb_doc_free((fdb_doc *)0x119df3);
                sprintf((char *)local_268,local_47e,(ulong)local_58,"kv1_custom_cmp(updated)");
                strlen((char *)&local_168);
                fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                               (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                               (void *)0x119e5e,(size_t)in_stack_fffffffffffff840);
                fVar1 = fdb_get(local_498,in_stack_fffffffffffffa48);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7d7);
                  multi_kv_custom_cmp_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x7d7,"void multi_kv_custom_cmp_test()");
                  }
                }
                iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,
                               in_stack_fffffffffffffa48->bodylen);
                if (iVar2 != 0) break;
                fdb_doc_free((fdb_doc *)0x119f78);
                sprintf((char *)local_268,local_47e,(ulong)local_58,"kv2(updated)");
                in_stack_fffffffffffff828 = &local_168;
                strlen((char *)&local_168);
                fhandle = (fdb_file_handle *)0x0;
                fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                               (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                               (void *)0x119fe3,(size_t)in_stack_fffffffffffff840);
                fVar1 = fdb_get(local_4a0,in_stack_fffffffffffffa48);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7de);
                  multi_kv_custom_cmp_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x7de,"void multi_kv_custom_cmp_test()");
                  }
                }
                iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,
                               in_stack_fffffffffffffa48->bodylen);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                          in_stack_fffffffffffffa48->body,local_268,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x7df);
                  multi_kv_custom_cmp_test::__test_pass = 0;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x7df,"void multi_kv_custom_cmp_test()");
                }
                fdb_doc_free((fdb_doc *)0x11a0fd);
                local_58 = local_58 + 1;
              }
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                      in_stack_fffffffffffffa48->body,local_268,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x7d8);
              multi_kv_custom_cmp_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x7d8,"void multi_kv_custom_cmp_test()");
            }
            sprintf((char *)&local_168,local_470,(ulong)local_58);
            sprintf((char *)local_268,local_47e,(ulong)local_58,"default");
            strlen((char *)&local_168);
            fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                           (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                           (void *)0x11938d,(size_t)in_stack_fffffffffffff840);
            fVar1 = fdb_get(local_490,in_stack_fffffffffffffa48);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x79c);
              multi_kv_custom_cmp_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x79c,"void multi_kv_custom_cmp_test()");
              }
            }
            iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,
                           in_stack_fffffffffffffa48->bodylen);
            if (iVar2 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                      in_stack_fffffffffffffa48->body,local_268,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x79d);
              multi_kv_custom_cmp_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x79d,"void multi_kv_custom_cmp_test()");
            }
            fdb_doc_free((fdb_doc *)0x1194a7);
            sprintf((char *)local_268,local_47e,(ulong)local_58,"kv1_custom_cmp");
            strlen((char *)&local_168);
            fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                           (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                           (void *)0x119518,(size_t)in_stack_fffffffffffff840);
            fVar1 = fdb_get(local_498,in_stack_fffffffffffffa48);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x7a3);
              multi_kv_custom_cmp_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7a3,"void multi_kv_custom_cmp_test()");
              }
            }
            iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,
                           in_stack_fffffffffffffa48->bodylen);
            if (iVar2 != 0) break;
            fdb_doc_free((fdb_doc *)0x119632);
            sprintf((char *)local_268,local_47e,(ulong)local_58,"kv2");
            in_stack_fffffffffffff888 = &local_168;
            strlen((char *)&local_168);
            fhandle = (fdb_file_handle *)0x0;
            fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                           (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                           (void *)0x1196a3,(size_t)in_stack_fffffffffffff840);
            fVar1 = fdb_get(local_4a0,in_stack_fffffffffffffa48);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x7aa);
              multi_kv_custom_cmp_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x7aa,"void multi_kv_custom_cmp_test()");
              }
            }
            iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,
                           in_stack_fffffffffffffa48->bodylen);
            if (iVar2 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                      in_stack_fffffffffffffa48->body,local_268,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x7ab);
              multi_kv_custom_cmp_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x7ab,"void multi_kv_custom_cmp_test()");
            }
            fdb_doc_free((fdb_doc *)0x1197bd);
            local_58 = local_58 + 1;
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                  in_stack_fffffffffffffa48->body,local_268,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x7a4);
          multi_kv_custom_cmp_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x7a4,"void multi_kv_custom_cmp_test()");
        }
        sprintf((char *)&local_168,local_470,(ulong)local_58);
        sprintf((char *)local_268,local_47e,(ulong)local_58,"default");
        strlen((char *)&local_168);
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                       (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                       (void *)0x118d8c,(size_t)in_stack_fffffffffffff840);
        fVar1 = fdb_get(local_490,in_stack_fffffffffffffa48);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x779);
          multi_kv_custom_cmp_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x779,"void multi_kv_custom_cmp_test()");
          }
        }
        iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,in_stack_fffffffffffffa48->bodylen)
        ;
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                  in_stack_fffffffffffffa48->body,local_268,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x77a);
          multi_kv_custom_cmp_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x77a,"void multi_kv_custom_cmp_test()");
        }
        fdb_doc_free((fdb_doc *)0x118ea6);
        sprintf((char *)local_268,local_47e,(ulong)local_58,"kv1_custom_cmp");
        strlen((char *)&local_168);
        fhandle = (fdb_file_handle *)0x0;
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                       (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,
                       (void *)0x118f17,(size_t)in_stack_fffffffffffff840);
        fVar1 = fdb_get(local_498,in_stack_fffffffffffffa48);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x780);
          multi_kv_custom_cmp_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x780,"void multi_kv_custom_cmp_test()");
          }
        }
        iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,in_stack_fffffffffffffa48->bodylen)
        ;
        if (iVar2 != 0) break;
        fdb_doc_free((fdb_doc *)0x119031);
        local_58 = local_58 + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",in_stack_fffffffffffffa48->body,
              local_268,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x781);
      multi_kv_custom_cmp_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x781,"void multi_kv_custom_cmp_test()");
    }
    sprintf((char *)&local_168,local_470,(ulong)local_58);
    sprintf((char *)local_268,local_47e,(ulong)local_58,"default");
    strlen((char *)&local_168);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                   (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,(void *)0x11866a,
                   (size_t)in_stack_fffffffffffff840);
    fVar1 = fdb_get(local_490,in_stack_fffffffffffffa48);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x74b);
      multi_kv_custom_cmp_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x74b,"void multi_kv_custom_cmp_test()");
      }
    }
    iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,in_stack_fffffffffffffa48->bodylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",in_stack_fffffffffffffa48->body,
              local_268,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x74c);
      multi_kv_custom_cmp_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x74c,"void multi_kv_custom_cmp_test()");
    }
    fdb_doc_free((fdb_doc *)0x118784);
    sprintf((char *)local_268,local_47e,(ulong)local_58,"kv1_custom_cmp");
    strlen((char *)&local_168);
    in_stack_fffffffffffff808 = (fdb_file_handle *)0x0;
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                   (size_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,0,(void *)0x1187f5,
                   (size_t)in_stack_fffffffffffff840);
    fVar1 = fdb_get(local_498,in_stack_fffffffffffffa48);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x752);
      multi_kv_custom_cmp_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x752,"void multi_kv_custom_cmp_test()");
      }
    }
    iVar2 = memcmp(local_268,in_stack_fffffffffffffa48->body,in_stack_fffffffffffffa48->bodylen);
    if (iVar2 != 0) break;
    fdb_doc_free((fdb_doc *)0x11890f);
    local_58 = local_58 + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",in_stack_fffffffffffffa48->body,
          local_268,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
          ,0x753);
  multi_kv_custom_cmp_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x753,"void multi_kv_custom_cmp_test()");
}

Assistant:

void multi_kv_custom_cmp_test()
{
    TEST_INIT();

    int n = 1000;
    int i, r;
    char key[256], value[256];
    char keyBuf[256], valueBuf[256];
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d(%s)";
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1, *kv2;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_iterator *it;
    fdb_status s;

    sprintf(value, SHELL_DEL" multi_kv_test*");
    r = system(value);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.multi_kv_instances = true;
    config.wal_threshold = 256;
    config.wal_flush_before_commit = false;
    config.buffercache_size = 0;

    s = fdb_open(&dbfile, "./multi_kv_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'default' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // create 'kv1' using custom cmp function
    kvs_config.custom_cmp = _multi_kv_test_keycmp;
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // close & reopen handles
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    kvs_config.custom_cmp = NULL;
    s = fdb_open(&dbfile, "./multi_kv_test", &config);
    TEST_CHK(s != FDB_RESULT_SUCCESS); // must fail

    { // retry with wrong cmp function
        char *kvs_names[] = {NULL};
        fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp};
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                1, kvs_names, functions, NULL);
        TEST_CHK(s != FDB_RESULT_SUCCESS); // must fail
    }

    { // retry with correct function
        char *kvs_names[] = {(char*)"kv1"};
        fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp};
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                1, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS); // must succeed this time
    }

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // create one more KV store
    kvs_config.custom_cmp = NULL;
    s = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert using 'kv2' instance
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv2");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // update all documents
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);

        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);

        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    // WAL flush at once
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // do compaction
    s = fdb_compact(dbfile, "./multi_kv_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i) {
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);

        sprintf(value, valuestr, i, "kv2(updated)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // pre-allocate memory and re-use it for the iterator return document
    s = fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    doc->key = &keyBuf[0];
    doc->body = &valueBuf[0];

    // create full iterator for 'kv1'
    i = 0;
    s = fdb_iterator_init(kv1, &it, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    do {
        s = fdb_iterator_get(it, &doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "kv1_custom_cmp(updated)");
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        i++;
    } while (fdb_iterator_next(it) == FDB_RESULT_SUCCESS);
    TEST_CHK(i == n);
    s = fdb_iterator_close(it);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // release the pre-allocated memory for the iterator return document
    doc->key = NULL;
    doc->body = NULL;
    s = fdb_doc_free(doc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    memleak_end();

    TEST_RESULT("multiple KV instances custom comparison function test");
}